

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QuadratureMouse.hpp
# Opt level: O0

void __thiscall Inputs::QuadratureMouse::prepare_step(QuadratureMouse *this)

{
  __int_type_conflict _Var1;
  uint local_14;
  int axis_value;
  int axis;
  QuadratureMouse *this_local;
  
  for (local_14 = 0; (int)local_14 < 2; local_14 = local_14 + 1) {
    _Var1 = std::__atomic_base::operator_cast_to_int((__atomic_base *)(this->axes_ + (int)local_14))
    ;
    if (_Var1 != 0) {
      this->primaries_[(int)local_14] = this->primaries_[(int)local_14] ^ 1;
      this->secondaries_[(int)local_14] = this->primaries_[(int)local_14] ^ local_14;
      if (_Var1 < 1) {
        std::__atomic_base<int>::operator++(&this->axes_[(int)local_14].super___atomic_base<int>);
      }
      else {
        std::__atomic_base<int>::operator--(&this->axes_[(int)local_14].super___atomic_base<int>);
        this->secondaries_[(int)local_14] = this->secondaries_[(int)local_14] ^ 1;
      }
    }
  }
  return;
}

Assistant:

void prepare_step() {
			for(int axis = 0; axis < 2; ++axis) {
				// Do nothing if there's no motion to communicate.
				const int axis_value = axes_[axis];
				if(!axis_value) continue;

				// Toggle the primary channel and set the secondary for
				// negative motion. At present the y axis signals the
				// secondary channel the opposite way around from the
				// primary.
				primaries_[axis] ^= 1;
				secondaries_[axis] = primaries_[axis] ^ axis;
				if(axis_value > 0) {
					-- axes_[axis];
					secondaries_[axis] ^= 1;	// Switch to positive motion.
				} else {
					++ axes_[axis];
				}
			}
		}